

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O3

ssize_t __thiscall
slang::ast::ASTSerializer::write(ASTSerializer *this,int __fd,void *__buf,size_t __n)

{
  JsonWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 in_register_00000034;
  string_view name;
  string_view value;
  string local_38;
  
  name._M_len._4_4_ = in_register_00000034;
  name._M_len._0_4_ = __fd;
  name._M_str = (char *)__buf;
  JsonWriter::writeProperty(this->writer,name);
  this_00 = this->writer;
  ConstantValue::toString_abi_cxx11_(&local_38,(ConstantValue *)__n,0xffffff,true,true);
  value._M_str = local_38._M_dataplus._M_p;
  value._M_len = local_38._M_string_length;
  JsonWriter::writeValue(this_00,value);
  paVar1 = &local_38.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    paVar1 = extraout_RAX;
  }
  return (ssize_t)paVar1;
}

Assistant:

void ASTSerializer::write(std::string_view name, const ConstantValue& value) {
    writer.writeProperty(name);
    writer.writeValue(value.toString(SVInt::MAX_BITS, /* exactUnknowns */ true,
                                     /* useAssignmentPatterns */ true));
}